

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_primitives.h
# Opt level: O1

int int_of_substring(substring s)

{
  int iVar1;
  size_t sVar3;
  char *pcVar4;
  char *__nptr;
  char *endptr;
  char *local_50 [2];
  char local_40 [16];
  char *local_30;
  long lVar2;
  
  pcVar4 = s.end;
  __nptr = s.begin;
  local_30 = pcVar4;
  lVar2 = strtol(__nptr,&local_30,10);
  iVar1 = (int)lVar2;
  if (__nptr != pcVar4 && local_30 == __nptr) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"warning: ",9);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,__nptr,pcVar4);
    pcVar4 = local_50[0];
    if (local_50[0] == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x2db5d0);
    }
    else {
      sVar3 = strlen(local_50[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," is not a good int, replacing with 0",0x24);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

inline int int_of_substring(substring s)
{
  char* endptr = s.end;
  int i = strtol(s.begin, &endptr, 10);
  if (endptr == s.begin && s.begin != s.end)
  {
    std::cout << "warning: " << std::string(s.begin, s.end - s.begin).c_str() << " is not a good int, replacing with 0"
              << std::endl;
    i = 0;
  }

  return i;
}